

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O1

FILE * fopen_comp(char *file,char *mode,int32 *ispipe)

{
  int iVar1;
  FILE *pFVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  int32 isgz;
  int local_1c;
  
  guess_comptype(file,ispipe,&local_1c);
  if (*ispipe == 0) {
    pFVar2 = fopen(file,mode);
    return (FILE *)pFVar2;
  }
  iVar1 = strcmp(mode,"r");
  if (iVar1 == 0) {
    if (local_1c == 1) {
      pcVar5 = "zcat";
      pcVar4 = " ";
    }
    else {
      if (local_1c == 3) {
        pcVar5 = "bunzip2";
      }
      else {
        if (local_1c != 2) {
          pcVar4 = "Unknown  compression type %d\n";
          lVar3 = 0x8a;
          goto LAB_0010e67d;
        }
        pcVar5 = "gunzip";
      }
      pcVar4 = " -c ";
    }
    pcVar4 = string_join(pcVar5,pcVar4,file,0);
    pFVar2 = popen(pcVar4,mode);
    if (pFVar2 != (FILE *)0x0) goto LAB_0010e640;
    lVar3 = 0x8d;
  }
  else {
    iVar1 = strcmp(mode,"w");
    if (iVar1 != 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
              ,0xab,"Compressed file operation for mode %s is not supported\n",mode);
      return (FILE *)0x0;
    }
    if (local_1c == 1) {
      pcVar5 = "compress";
      pcVar4 = " -c > ";
    }
    else {
      if (local_1c == 3) {
        pcVar5 = "bzip2";
      }
      else {
        if (local_1c != 2) {
          pcVar4 = "Unknown compression type %d\n";
          lVar3 = 0xa1;
LAB_0010e67d:
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                  ,lVar3,pcVar4);
          exit(1);
        }
        pcVar5 = "gzip";
      }
      pcVar4 = " > ";
    }
    pcVar4 = string_join(pcVar5,pcVar4,file,0);
    pFVar2 = popen(pcVar4,mode);
    if (pFVar2 != (FILE *)0x0) goto LAB_0010e640;
    lVar3 = 0xa4;
  }
  pFVar2 = (FILE *)0x0;
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                 ,lVar3,"Failed to open a pipe for a command \'%s\' mode \'%s\'",pcVar4,mode);
LAB_0010e640:
  ckd_free(pcVar4);
  return (FILE *)pFVar2;
}

Assistant:

FILE *
fopen_comp(const char *file, const char *mode, int32 * ispipe)
{
    FILE *fp;

#ifndef HAVE_POPEN
    *ispipe = 0; /* No popen() on WinCE */
#else /* HAVE_POPEN */
    int32 isgz;
    guess_comptype(file, ispipe, &isgz);
#endif /* HAVE_POPEN */

    if (*ispipe) {
#ifndef HAVE_POPEN
        /* Shouldn't get here, anyway */
        E_FATAL("No popen() on WinCE\n");
#else
        if (strcmp(mode, "r") == 0) {
            char *command;
            switch (isgz) {
            case COMP_GZIP:
                command = string_join("gunzip" EXEEXT, " -c ", file, NULL);
                break;
            case COMP_COMPRESS:
                command = string_join("zcat" EXEEXT, " ", file, NULL);
                break;
            case COMP_BZIP2:
                command = string_join("bunzip2" EXEEXT, " -c ", file, NULL);
                break;
            default:
                command = NULL; /* Make compiler happy. */
                E_FATAL("Unknown  compression type %d\n", isgz);
            }
            if ((fp = popen(command, mode)) == NULL) {
                E_ERROR_SYSTEM("Failed to open a pipe for a command '%s' mode '%s'", command, mode);
                ckd_free(command);
                return NULL;
            }
            ckd_free(command);
        }
        else if (strcmp(mode, "w") == 0) {
            char *command;
            switch (isgz) {
            case COMP_GZIP:
                command = string_join("gzip" EXEEXT, " > ", file, NULL);
                break;
            case COMP_COMPRESS:
                command = string_join("compress" EXEEXT, " -c > ", file, NULL);
                break;
            case COMP_BZIP2:
                command = string_join("bzip2" EXEEXT, " > ", file, NULL);
                break;
            default:
                command = NULL; /* Make compiler happy. */
                E_FATAL("Unknown compression type %d\n", isgz);
            }
            if ((fp = popen(command, mode)) == NULL) {
                E_ERROR_SYSTEM("Failed to open a pipe for a command '%s' mode '%s'", command, mode);
                ckd_free(command);
                return NULL;
            }
            ckd_free(command);
        }
        else {
            E_ERROR("Compressed file operation for mode %s is not supported\n", mode);
            return NULL;
        }
#endif /* HAVE_POPEN */
    }
    else {
        fp = fopen(file, mode);
    }

    return (fp);
}